

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::ComputeArguments(cmCTestRunTest *this)

{
  cmCTest *pcVar1;
  ostream *poVar2;
  cmCTestTestProperties *pcVar3;
  char *pcVar4;
  string *arg;
  pointer pbVar5;
  string *env;
  pointer pbVar6;
  string *exe;
  char *local_1f0 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string testCommand;
  ostringstream cmCTestLog_msg;
  
  __range1 = &this->Arguments;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(__range1);
  pbVar5 = (this->TestProperties->Args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  exe = pbVar5 + 1;
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::string::_M_assign((string *)&this->ActualCommand);
    cmCTestTestHandler::FindTheExecutable
              ((string *)&cmCTestLog_msg,this->TestHandler,
               (this->TestProperties->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=
              ((string *)
               ((this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1),(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  else {
    cmCTestTestHandler::FindTheExecutable((string *)&cmCTestLog_msg,this->TestHandler,exe);
    std::__cxx11::string::operator=((string *)&this->ActualCommand,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    exe = pbVar5 + 2;
  }
  cmSystemTools::ConvertToOutputPath(&testCommand,&this->ActualCommand);
  (*(this->TestHandler->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[8])
            (this->TestHandler,__range1,(ulong)(uint)this->Index);
  pbVar6 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar6; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::append((char *)&testCommand);
    std::__cxx11::string::append((string *)&testCommand);
    std::__cxx11::string::append((char *)&testCommand);
  }
  for (; exe != (this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; exe = exe + 1) {
    std::__cxx11::string::append((char *)&testCommand);
    std::__cxx11::string::append((string *)&testCommand);
    std::__cxx11::string::append((char *)&testCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__range1,exe);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).FullCommandLine);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Index);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar4 = "Test";
  if (this->TestHandler->MemCheck != false) {
    pcVar4 = "MemCheck";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," command: ");
  poVar2 = std::operator<<(poVar2,(string *)&testCommand);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2b3,local_1f0[0],false);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar3 = this->TestProperties;
  if ((pcVar3->Directory)._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"Working Directory: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->TestProperties->Directory);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2ba,local_1f0[0],false);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pcVar3 = this->TestProperties;
  }
  pbVar5 = (pcVar3->Environment).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = pbVar5;
  if (pbVar5 != (pcVar3->Environment).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"Environment variables: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2c1,local_1f0[0],false);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pbVar6 = (this->TestProperties->Environment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->TestProperties->Environment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pbVar6 != pbVar5; pbVar6 = pbVar6 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,":  ");
    poVar2 = std::operator<<(poVar2,(string *)pbVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2c5,local_1f0[0],false);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  pbVar5 = (this->TestProperties->EnvironmentModification).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = pbVar5;
  if (pbVar5 != (this->TestProperties->EnvironmentModification).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"Environment variable modifications: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2cb,local_1f0[0],false);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pbVar6 = (this->TestProperties->EnvironmentModification).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->TestProperties->EnvironmentModification).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pbVar6 != pbVar5; pbVar6 = pbVar6 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,":  ");
    poVar2 = std::operator<<(poVar2,(string *)pbVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2d0,local_1f0[0],false);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::string::~string((string *)&testCommand);
  return;
}

Assistant:

void cmCTestRunTest::ComputeArguments()
{
  this->Arguments.clear(); // reset because this might be a rerun
  auto j = this->TestProperties->Args.begin();
  ++j; // skip test name
  // find the test executable
  if (this->TestHandler->MemCheck) {
    cmCTestMemCheckHandler* handler =
      static_cast<cmCTestMemCheckHandler*>(this->TestHandler);
    this->ActualCommand = handler->MemoryTester;
    this->TestProperties->Args[1] =
      this->TestHandler->FindTheExecutable(this->TestProperties->Args[1]);
  } else {
    this->ActualCommand =
      this->TestHandler->FindTheExecutable(this->TestProperties->Args[1]);
    ++j; // skip the executable (it will be actualCommand)
  }
  std::string testCommand =
    cmSystemTools::ConvertToOutputPath(this->ActualCommand);

  // Prepends memcheck args to our command string
  this->TestHandler->GenerateTestCommand(this->Arguments, this->Index);
  for (std::string const& arg : this->Arguments) {
    testCommand += " \"";
    testCommand += arg;
    testCommand += "\"";
  }

  for (; j != this->TestProperties->Args.end(); ++j) {
    testCommand += " \"";
    testCommand += *j;
    testCommand += "\"";
    this->Arguments.push_back(*j);
  }
  this->TestResult.FullCommandLine = testCommand;

  // Print the test command in verbose mode
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             std::endl
               << this->Index << ": "
               << (this->TestHandler->MemCheck ? "MemCheck" : "Test")
               << " command: " << testCommand << std::endl);

  // Print any test-specific env vars in verbose mode
  if (!this->TestProperties->Directory.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Working Directory: "
                           << this->TestProperties->Directory << std::endl);
  }

  // Print any test-specific env vars in verbose mode
  if (!this->TestProperties->Environment.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Environment variables: " << std::endl);
  }
  for (std::string const& env : this->TestProperties->Environment) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ":  " << env << std::endl);
  }
  if (!this->TestProperties->EnvironmentModification.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Environment variable modifications: "
                           << std::endl);
  }
  for (std::string const& envmod :
       this->TestProperties->EnvironmentModification) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ":  " << envmod << std::endl);
  }
}